

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostkey.c
# Opt level: O0

int hostkey_type(uchar *hostkey,size_t len)

{
  int iVar1;
  size_t len_local;
  uchar *hostkey_local;
  
  if (len < 0xb) {
    hostkey_local._4_4_ = 0;
  }
  else {
    iVar1 = memcmp("",hostkey,0xb);
    if (iVar1 == 0) {
      hostkey_local._4_4_ = 1;
    }
    else {
      iVar1 = memcmp("",hostkey,0xb);
      if (iVar1 == 0) {
        hostkey_local._4_4_ = 2;
      }
      else if (len < 0xf) {
        hostkey_local._4_4_ = 0;
      }
      else {
        iVar1 = memcmp("",hostkey,0xf);
        if (iVar1 == 0) {
          hostkey_local._4_4_ = 6;
        }
        else if (len < 0x17) {
          hostkey_local._4_4_ = 0;
        }
        else {
          iVar1 = memcmp("",hostkey,0x17);
          if (iVar1 == 0) {
            hostkey_local._4_4_ = 3;
          }
          else {
            iVar1 = memcmp("",hostkey,0x17);
            if (iVar1 == 0) {
              hostkey_local._4_4_ = 4;
            }
            else {
              iVar1 = memcmp("",hostkey,0x17);
              if (iVar1 == 0) {
                hostkey_local._4_4_ = 5;
              }
              else {
                hostkey_local._4_4_ = 0;
              }
            }
          }
        }
      }
    }
  }
  return hostkey_local._4_4_;
}

Assistant:

static int hostkey_type(const unsigned char *hostkey, size_t len)
{
    static const unsigned char rsa[] = {
        0, 0, 0, 0x07, 's', 's', 'h', '-', 'r', 's', 'a'
    };
    static const unsigned char dss[] = {
        0, 0, 0, 0x07, 's', 's', 'h', '-', 'd', 's', 's'
    };
    static const unsigned char ecdsa_256[] = {
        0, 0, 0, 0x13, 'e', 'c', 'd', 's', 'a', '-', 's', 'h', 'a', '2', '-',
        'n', 'i', 's', 't', 'p', '2', '5', '6'
    };
    static const unsigned char ecdsa_384[] = {
        0, 0, 0, 0x13, 'e', 'c', 'd', 's', 'a', '-', 's', 'h', 'a', '2', '-',
        'n', 'i', 's', 't', 'p', '3', '8', '4'
    };
    static const unsigned char ecdsa_521[] = {
        0, 0, 0, 0x13, 'e', 'c', 'd', 's', 'a', '-', 's', 'h', 'a', '2', '-',
        'n', 'i', 's', 't', 'p', '5', '2', '1'
    };
    static const unsigned char ed25519[] = {
        0, 0, 0, 0x0b, 's', 's', 'h', '-', 'e', 'd', '2', '5', '5', '1', '9'
    };

    if(len < 11)
        return LIBSSH2_HOSTKEY_TYPE_UNKNOWN;

    if(!memcmp(rsa, hostkey, 11))
        return LIBSSH2_HOSTKEY_TYPE_RSA;

    if(!memcmp(dss, hostkey, 11))
        return LIBSSH2_HOSTKEY_TYPE_DSS;

    if(len < 15)
        return LIBSSH2_HOSTKEY_TYPE_UNKNOWN;

    if(!memcmp(ed25519, hostkey, 15))
        return LIBSSH2_HOSTKEY_TYPE_ED25519;

    if(len < 23)
        return LIBSSH2_HOSTKEY_TYPE_UNKNOWN;

    if(!memcmp(ecdsa_256, hostkey, 23))
        return LIBSSH2_HOSTKEY_TYPE_ECDSA_256;

    if(!memcmp(ecdsa_384, hostkey, 23))
        return LIBSSH2_HOSTKEY_TYPE_ECDSA_384;

    if(!memcmp(ecdsa_521, hostkey, 23))
        return LIBSSH2_HOSTKEY_TYPE_ECDSA_521;

    return LIBSSH2_HOSTKEY_TYPE_UNKNOWN;
}